

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress1X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  long lVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  bool bVar12;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar3 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar3;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
  }
  else if (cSrcSize < 8) {
    uVar6 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar6 = uVar6 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 != 0) {
      uVar7 = 0x1f;
      if (bVar4 != 0) {
        for (; bVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
      lVar2 = 0;
LAB_0023693a:
      puVar1 = (undefined1 *)((long)dst + maxDstSize);
      pvVar11 = (void *)((long)cSrc + lVar2);
      bVar4 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
      do {
        if (lVar2 < 8) {
          if (lVar2 == 0) {
LAB_00236a58:
            for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
              uVar9 = (uVar6 << ((byte)uVar7 & 0x3f)) >> bVar4;
              uVar7 = uVar7 + *(byte *)((long)DTable + uVar9 * 2 + 5);
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
            }
            if (uVar7 != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (pvVar11 == cSrc) {
              return maxDstSize;
            }
            return 0xffffffffffffffec;
          }
          uVar5 = uVar7 >> 3;
          bVar12 = cSrc <= (void *)((long)pvVar11 - (ulong)uVar5);
          if (!bVar12) {
            uVar5 = (uint)lVar2;
          }
          uVar7 = uVar7 + uVar5 * -8;
        }
        else {
          uVar5 = uVar7 >> 3;
          uVar7 = uVar7 & 7;
          bVar12 = true;
        }
        lVar2 = lVar2 - (ulong)uVar5;
        pvVar11 = (void *)((long)cSrc + lVar2);
        uVar6 = *(ulong *)((long)cSrc + lVar2);
        if ((puVar1 + -3 <= dst) || (!bVar12)) goto LAB_00236a58;
        uVar9 = (uVar6 << ((byte)uVar7 & 0x3f)) >> bVar4;
        iVar8 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar7;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
        uVar10 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
        iVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar8;
        uVar9 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
        iVar8 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar8;
        uVar10 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
        uVar7 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar8;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
        dst = (void *)((long)dst + 4);
        if (0x40 < uVar7) goto LAB_00236a58;
      } while( true );
    }
    cSrcSize = 0xffffffffffffffec;
  }
  else {
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      cSrcSize = 0xffffffffffffffff;
    }
    else if (cSrcSize < 0xffffffffffffff89) {
      uVar6 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      lVar2 = cSrcSize - 8;
      uVar7 = 0x1f;
      if (bVar4 != 0) {
        for (; bVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = ~uVar7 + 9;
      goto LAB_0023693a;
    }
  }
  return cSrcSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}